

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void duckdb_fmt::v6::internal::fallback_format<double>(double d,buffer<char> *buf,int *exp10)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  char *pcVar5;
  size_t sVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  bigint *lhs2;
  uint64_t value;
  int iVar11;
  int exp;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int num_bigits;
  ulong size;
  bool bVar15;
  bigint numerator;
  bigint lower;
  bigint upper_store;
  bigint denominator;
  bigint *local_328;
  ulong local_308;
  bigint local_2d0;
  bigint local_228;
  bigint local_180;
  bigint local_d8;
  
  local_2d0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2d0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0246cda8;
  puVar1 = local_2d0.bigits_.store_;
  local_2d0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2d0.exp_ = 0;
  local_d8.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_d8.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0246cda8;
  puVar2 = local_d8.bigits_.store_;
  local_d8.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_d8.exp_ = 0;
  local_228.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_228.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0246cda8;
  puVar3 = local_228.bigits_.store_;
  local_228.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_228.exp_ = 0;
  local_328 = &local_180;
  local_180.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_180.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0246cda8;
  puVar4 = local_180.bigits_.store_;
  local_180.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_180.exp_ = 0;
  uVar10 = (ulong)d & 0xfffffffffffff;
  uVar12 = (ulong)d >> 0x34 & 0x7ff;
  local_2d0.bigits_.super_buffer<unsigned_int>.ptr_ = puVar1;
  local_228.bigits_.super_buffer<unsigned_int>.ptr_ = puVar3;
  local_180.bigits_.super_buffer<unsigned_int>.ptr_ = puVar4;
  local_d8.bigits_.super_buffer<unsigned_int>.ptr_ = puVar2;
  if (uVar12 == 0) {
    value = uVar10 * 2;
    iVar11 = -0x432;
    iVar14 = 1;
    bVar15 = false;
    local_308 = uVar10;
LAB_017f21f9:
    exp = *exp10;
    if (exp < 0) {
      bigint::assign_pow10(&local_2d0,-exp);
      sVar6 = local_2d0.bigits_.super_buffer<unsigned_int>.size_;
      if (local_228.bigits_.super_buffer<unsigned_int>.capacity_ <
          local_2d0.bigits_.super_buffer<unsigned_int>.size_) {
        (**local_228.bigits_.super_buffer<unsigned_int>._vptr_buffer)
                  (&local_228,local_2d0.bigits_.super_buffer<unsigned_int>.size_);
      }
      local_228.bigits_.super_buffer<unsigned_int>.size_ = sVar6;
      if (local_2d0.bigits_.super_buffer<unsigned_int>.size_ != 0) {
        memmove(local_228.bigits_.super_buffer<unsigned_int>.ptr_,
                local_2d0.bigits_.super_buffer<unsigned_int>.ptr_,
                local_2d0.bigits_.super_buffer<unsigned_int>.size_ << 2);
      }
      sVar6 = local_2d0.bigits_.super_buffer<unsigned_int>.size_;
      local_228.exp_ = local_2d0.exp_;
      if (bVar15) {
        if (local_180.bigits_.super_buffer<unsigned_int>.capacity_ <
            local_2d0.bigits_.super_buffer<unsigned_int>.size_) {
          (**local_180.bigits_.super_buffer<unsigned_int>._vptr_buffer)
                    (&local_180,local_2d0.bigits_.super_buffer<unsigned_int>.size_);
        }
        local_180.bigits_.super_buffer<unsigned_int>.size_ = sVar6;
        if (local_2d0.bigits_.super_buffer<unsigned_int>.size_ != 0) {
          memmove(local_180.bigits_.super_buffer<unsigned_int>.ptr_,
                  local_2d0.bigits_.super_buffer<unsigned_int>.ptr_,
                  local_2d0.bigits_.super_buffer<unsigned_int>.size_ << 2);
        }
        local_328 = &local_180;
        local_180.exp_ = local_2d0.exp_;
        bigint::operator<<=(local_328,1);
      }
      else {
        local_328 = (bigint *)0x0;
      }
      bigint::multiply(&local_2d0,value);
      *local_d8.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
      if (local_d8.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
        (**local_d8.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_d8,1);
      }
      local_d8.bigits_.super_buffer<unsigned_int>.size_ = 1;
      local_d8.exp_ = 0;
      bigint::operator<<=(&local_d8,iVar14 - iVar11);
    }
    else {
      uVar10 = 0;
      do {
        local_2d0.bigits_.store_[uVar10] = (uint)value;
        uVar10 = uVar10 + 1;
        value = value >> 0x20;
      } while (value != 0);
      if (0x20 < uVar10) {
        basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::grow
                  (&local_2d0.bigits_,uVar10);
        exp = *exp10;
      }
      local_2d0.exp_ = 0;
      local_2d0.bigits_.super_buffer<unsigned_int>.size_ = uVar10;
      bigint::assign_pow10(&local_d8,exp);
      bigint::operator<<=(&local_d8,iVar14 - iVar11);
      *local_228.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
      if (local_228.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
        (**local_228.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_228,1);
      }
      local_228.bigits_.super_buffer<unsigned_int>.size_ = 1;
      local_228.exp_ = 0;
      if (bVar15) {
        *local_180.bigits_.super_buffer<unsigned_int>.ptr_ = 2;
        if (local_180.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
          (**local_180.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_180,1);
        }
        local_328 = &local_180;
        local_180.bigits_.super_buffer<unsigned_int>.size_ = 1;
        local_180.exp_ = 0;
      }
      else {
        local_328 = (bigint *)0x0;
      }
    }
  }
  else {
    local_308 = uVar10 + 0x10000000000000;
    iVar11 = (int)uVar12 + -0x433;
    bVar15 = uVar12 != 1 && uVar10 == 0;
    iVar14 = bVar15 + 1;
    value = local_308 << (sbyte)iVar14;
    if (uVar12 < 0x433) goto LAB_017f21f9;
    size = 0;
    do {
      local_2d0.bigits_.store_[size] = (uint)value;
      size = size + 1;
      value = value >> 0x20;
    } while (value != 0);
    if (0x20 < size) {
      basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::grow
                (&local_2d0.bigits_,size);
    }
    local_2d0.exp_ = 0;
    local_2d0.bigits_.super_buffer<unsigned_int>.size_ = size;
    bigint::operator<<=(&local_2d0,iVar11);
    *local_228.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
    if (local_228.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
      (**local_228.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_228,1);
    }
    local_228.bigits_.super_buffer<unsigned_int>.size_ = 1;
    local_228.exp_ = 0;
    bigint::operator<<=(&local_228,iVar11);
    if (uVar12 != 1 && uVar10 == 0) {
      *local_180.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
      if (local_180.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
        (**local_180.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_180,1);
      }
      local_180.bigits_.super_buffer<unsigned_int>.size_ = 1;
      local_180.exp_ = 0;
      bigint::operator<<=(&local_180,(int)uVar12 + -0x432);
    }
    else {
      local_328 = (bigint *)0x0;
    }
    bigint::assign_pow10(&local_d8,*exp10);
    bigint::operator<<=(&local_d8,1);
  }
  lhs2 = local_328;
  if (local_328 == (bigint *)0x0) {
    lhs2 = &local_228;
  }
  pcVar5 = buf->ptr_;
  uVar8 = ~(uint)local_308 & 1;
  lVar13 = 0;
  while( true ) {
    uVar9 = bigint::divmod_assign(&local_2d0,&local_d8);
    iVar11 = compare(&local_2d0,&local_228);
    iVar14 = add_compare(&local_2d0,lhs2,&local_d8);
    pcVar5[lVar13] = (char)uVar9 + '0';
    if ((iVar11 < (int)uVar8) || ((int)-uVar8 < iVar14)) break;
    bigint::multiply(&local_2d0,10);
    bigint::multiply(&local_228,10);
    if (local_328 != (bigint *)0x0) {
      bigint::multiply(local_328,10);
    }
    lVar13 = lVar13 + 1;
  }
  if (iVar11 < (int)uVar8) {
    if (iVar14 <= (int)-uVar8) goto LAB_017f2597;
    iVar11 = add_compare(&local_2d0,&local_2d0,&local_d8);
    if ((iVar11 < 1) && ((uVar9 & 1) == 0 || iVar11 != 0)) goto LAB_017f2597;
    cVar7 = pcVar5[lVar13] + '\x01';
  }
  else {
    cVar7 = (char)uVar9 + '1';
  }
  pcVar5[lVar13] = cVar7;
LAB_017f2597:
  uVar10 = lVar13 + 1U & 0xffffffff;
  if (buf->capacity_ < uVar10) {
    (**buf->_vptr_buffer)(buf,uVar10);
  }
  buf->size_ = uVar10;
  *exp10 = *exp10 - (int)lVar13;
  local_180.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0246cda8;
  if (local_180.bigits_.super_buffer<unsigned_int>.ptr_ != puVar4) {
    operator_delete(local_180.bigits_.super_buffer<unsigned_int>.ptr_);
  }
  local_228.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0246cda8;
  if (local_228.bigits_.super_buffer<unsigned_int>.ptr_ != puVar3) {
    operator_delete(local_228.bigits_.super_buffer<unsigned_int>.ptr_);
  }
  local_d8.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0246cda8;
  if (local_d8.bigits_.super_buffer<unsigned_int>.ptr_ != puVar2) {
    operator_delete(local_d8.bigits_.super_buffer<unsigned_int>.ptr_);
  }
  local_2d0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0246cda8;
  if (local_2d0.bigits_.super_buffer<unsigned_int>.ptr_ != puVar1) {
    operator_delete(local_2d0.bigits_.super_buffer<unsigned_int>.ptr_);
  }
  return;
}

Assistant:

void fallback_format(Double d, buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  // TODO: handle float
  int shift = value.assign(d) ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= 1;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  if (!upper) upper = &lower;
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  bool even = (value.f & 1) == 0;
  int num_digits = 0;
  char* data = buf.data();
  for (;;) {
    int digit = numerator.divmod_assign(denominator);
    bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
    // numerator + upper >[=] pow10:
    bool high = add_compare(numerator, *upper, denominator) + even > 0;
    data[num_digits++] = static_cast<char>('0' + digit);
    if (low || high) {
      if (!low) {
        ++data[num_digits - 1];
      } else if (high) {
        int result = add_compare(numerator, numerator, denominator);
        // Round half to even.
        if (result > 0 || (result == 0 && (digit % 2) != 0))
          ++data[num_digits - 1];
      }
      buf.resize(num_digits);
      exp10 -= num_digits - 1;
      return;
    }
    numerator *= 10;
    lower *= 10;
    if (upper != &lower) *upper *= 10;
  }
}